

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sender.cc
# Opt level: O3

void learn(sender *s,single_learner *param_2,example *ec)

{
  ulong uVar1;
  vw *pvVar2;
  
  pvVar2 = s->all;
  if ((s->received_index + (pvVar2->p->ring_size >> 1)) - 1 == s->sent_index) {
    receive_result(s);
    pvVar2 = s->all;
  }
  (*pvVar2->set_minmax)(pvVar2->sd,(ec->l).simple.label);
  (*(s->all->p->lp).cache_label)(&ec->l,s->buf);
  cache_tag(s->buf,ec->tag);
  send_features(s->buf,ec,(uint32_t)s->all->parse_mask);
  uVar1 = s->sent_index;
  s->sent_index = uVar1 + 1;
  s->delay_ring[uVar1 % s->all->p->ring_size] = ec;
  return;
}

Assistant:

void learn(sender& s, LEARNER::single_learner&, example& ec)
{
  if (s.received_index + s.all->p->ring_size / 2 - 1 == s.sent_index)
    receive_result(s);

  s.all->set_minmax(s.all->sd, ec.l.simple.label);
  s.all->p->lp.cache_label(&ec.l, *s.buf);  // send label information.
  cache_tag(*s.buf, ec.tag);
  send_features(s.buf, ec, (uint32_t)s.all->parse_mask);
  s.delay_ring[s.sent_index++ % s.all->p->ring_size] = &ec;
}